

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

Element * __thiscall Rml::Element::Closest(Element *this,String *selectors)

{
  pointer pcVar1;
  pointer ppSVar2;
  bool bVar3;
  StyleSheetNodeListRaw *__range2;
  Element *element;
  pointer ppSVar4;
  StyleSheetNodeListRaw leaf_nodes;
  String local_140;
  StyleSheetNode root_node;
  
  StyleSheetNode::StyleSheetNode(&root_node);
  StyleSheetParser::ConstructNodes(&leaf_nodes,&root_node,selectors);
  element = this;
  if (leaf_nodes.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      leaf_nodes.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (selectors->_M_dataplus)._M_p;
    GetAddress_abi_cxx11_(&local_140,this,false,true);
    Log::Message(LT_WARNING,"Query selector \'%s\' is empty. In element %s",pcVar1,
                 local_140._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_140);
  }
  else {
    while (ppSVar2 = leaf_nodes.
                     super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish, element = element->parent,
          ppSVar4 = leaf_nodes.
                    super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start, element != (Element *)0x0) {
      while (ppSVar4 != ppSVar2) {
        bVar3 = StyleSheetNode::IsApplicable(*ppSVar4,element,this);
        ppSVar4 = ppSVar4 + 1;
        if (bVar3) goto LAB_002814d4;
      }
    }
  }
  element = (Element *)0x0;
LAB_002814d4:
  ::std::_Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::~_Vector_base
            (&leaf_nodes.
              super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>);
  StyleSheetNode::~StyleSheetNode(&root_node);
  return element;
}

Assistant:

Element* Element::Closest(const String& selectors) const
{
	StyleSheetNode root_node;
	StyleSheetNodeListRaw leaf_nodes = StyleSheetParser::ConstructNodes(root_node, selectors);

	if (leaf_nodes.empty())
	{
		Log::Message(Log::LT_WARNING, "Query selector '%s' is empty. In element %s", selectors.c_str(), GetAddress().c_str());
		return nullptr;
	}

	Element* parent = GetParentNode();

	while (parent)
	{
		for (const StyleSheetNode* node : leaf_nodes)
		{
			if (node->IsApplicable(parent, this))
			{
				return parent;
			}
		}

		parent = parent->GetParentNode();
	}

	return nullptr;
}